

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB.cpp
# Opt level: O3

ErrorCode PDB::ValidateFile(void *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2[0] = -(*(char *)((long)data + 0xe) == '+');
  auVar2[1] = -(*(char *)((long)data + 0xf) == ' ');
  auVar2[2] = -(*(char *)((long)data + 0x10) == 'M');
  auVar2[3] = -(*(char *)((long)data + 0x11) == 'S');
  auVar2[4] = -(*(char *)((long)data + 0x12) == 'F');
  auVar2[5] = -(*(char *)((long)data + 0x13) == ' ');
  auVar2[6] = -(*(char *)((long)data + 0x14) == '7');
  auVar2[7] = -(*(char *)((long)data + 0x15) == '.');
  auVar2[8] = -(*(char *)((long)data + 0x16) == '0');
  auVar2[9] = -(*(char *)((long)data + 0x17) == '0');
  auVar2[10] = -(*(char *)((long)data + 0x18) == '\r');
  auVar2[0xb] = -(*(char *)((long)data + 0x19) == '\n');
  auVar2[0xc] = -(*(char *)((long)data + 0x1a) == '\x1a');
  auVar2[0xd] = -(*(char *)((long)data + 0x1b) == 'D');
  auVar2[0xe] = -(*(char *)((long)data + 0x1c) == 'S');
  auVar2[0xf] = -(*(char *)((long)data + 0x1d) == '\0');
  auVar1[0] = -(*data == 'M');
  auVar1[1] = -(*(char *)((long)data + 1) == 'i');
  auVar1[2] = -(*(char *)((long)data + 2) == 'c');
  auVar1[3] = -(*(char *)((long)data + 3) == 'r');
  auVar1[4] = -(*(char *)((long)data + 4) == 'o');
  auVar1[5] = -(*(char *)((long)data + 5) == 's');
  auVar1[6] = -(*(char *)((long)data + 6) == 'o');
  auVar1[7] = -(*(char *)((long)data + 7) == 'f');
  auVar1[8] = -(*(char *)((long)data + 8) == 't');
  auVar1[9] = -(*(char *)((long)data + 9) == ' ');
  auVar1[10] = -(*(char *)((long)data + 10) == 'C');
  auVar1[0xb] = -(*(char *)((long)data + 0xb) == '/');
  auVar1[0xc] = -(*(char *)((long)data + 0xc) == 'C');
  auVar1[0xd] = -(*(char *)((long)data + 0xd) == '+');
  auVar1[0xe] = -(*(char *)((long)data + 0xe) == '+');
  auVar1[0xf] = -(*(char *)((long)data + 0xf) == ' ');
  auVar1 = auVar1 & auVar2;
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar1[0xf] >> 7) << 0xf) != 0xffff) {
    return InvalidSuperBlock;
  }
  return (uint)(1 < *(int *)((long)data + 0x24) - 1U) * 2;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::ValidateFile(const void* data) PDB_NO_EXCEPT
{
	// validate the super block
	const SuperBlock* superBlock = Pointer::Offset<const SuperBlock*>(data, 0u);
	{
		// validate header magic
		if (std::memcmp(superBlock->fileMagic, SuperBlock::MAGIC, sizeof(SuperBlock::MAGIC)) != 0)
		{
			return ErrorCode::InvalidSuperBlock;
		}

		// validate free block map.
		// the free block map should always reside at either index 1 or 2.
		if (superBlock->freeBlockMapIndex != 1u && superBlock->freeBlockMapIndex != 2u)
		{
			return ErrorCode::InvalidFreeBlockMap;
		}
	}

	return ErrorCode::Success;
}